

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O2

DefaultValueObjectWriter * __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::StartObject
          (DefaultValueObjectWriter *this,StringPiece name)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  NodeKind NVar4;
  Type *pTVar5;
  int iVar6;
  Node *pNVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Node *pNVar8;
  Node **__x;
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
  local_f8;
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
  local_d8;
  undefined1 auStack_b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path;
  StringPiece name_local;
  undefined **local_70;
  undefined4 local_68;
  undefined4 local_60;
  undefined1 local_50;
  Node **local_48;
  Type *local_40;
  byte local_31;
  
  name_local.ptr_ = (char *)name.length_;
  path.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)name.ptr_;
  if (this->current_ == (Node *)0x0) {
    auStack_b8 = (undefined1  [8])0x0;
    path.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    path.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    StringPiece::ToString_abi_cxx11_
              ((string *)&name_local.length_,
               (StringPiece *)
               &path.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pTVar5 = this->type_;
    local_70 = &PTR__DataPiece_003e3c20;
    local_68 = 0xb;
    local_60 = 0;
    local_50 = 0;
    bVar2 = this->suppress_empty_list_;
    bVar3 = this->preserve_proto_field_names_;
    bVar1 = this->use_ints_for_enums_;
    std::
    function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
    ::function(&local_f8,&this->field_scrub_callback_);
    iVar6 = (*(this->super_ObjectWriter)._vptr_ObjectWriter[0x11])
                      (this,&name_local.length_,pTVar5,1,&local_70,0,auStack_b8,(ulong)bVar2,
                       (ulong)bVar3,(ulong)bVar1,&local_f8);
    pNVar7 = (this->root_)._M_t.
             super___uniq_ptr_impl<google::protobuf::util::converter::DefaultValueObjectWriter::Node,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
             .
             super__Head_base<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_false>
             ._M_head_impl;
    (this->root_)._M_t.
    super___uniq_ptr_impl<google::protobuf::util::converter::DefaultValueObjectWriter::Node,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
    .
    super__Head_base<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_false>
    ._M_head_impl = (Node *)CONCAT44(extraout_var,iVar6);
    if (pNVar7 != (Node *)0x0) {
      (*pNVar7->_vptr_Node[1])();
    }
    std::_Function_base::~_Function_base(&local_f8.super__Function_base);
    std::__cxx11::string::~string((string *)&name_local.length_);
    pNVar7 = (this->root_)._M_t.
             super___uniq_ptr_impl<google::protobuf::util::converter::DefaultValueObjectWriter::Node,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
             .
             super__Head_base<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_false>
             ._M_head_impl;
    (*pNVar7->_vptr_Node[2])(pNVar7,this->typeinfo_);
    this->current_ =
         (this->root_)._M_t.
         super___uniq_ptr_impl<google::protobuf::util::converter::DefaultValueObjectWriter::Node,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
         .
         super__Head_base<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_false>
         ._M_head_impl;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_b8);
  }
  else {
    __x = &this->current_;
    MaybePopulateChildrenOfAny(this,this->current_);
    pNVar7 = Node::FindChild(this->current_,name);
    NVar4 = this->current_->kind_;
    if ((NVar4 == LIST) || (pNVar7 == (Node *)0x0 || NVar4 == MAP)) {
      StringPiece::ToString_abi_cxx11_
                ((string *)&name_local.length_,
                 (StringPiece *)
                 &path.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pNVar8 = *__x;
      if ((pNVar8->kind_ & ~OBJECT) == LIST) {
        local_40 = pNVar8->type_;
      }
      else {
        local_40 = (Type *)0x0;
      }
      local_70 = &PTR__DataPiece_003e3c20;
      local_68 = 0xb;
      local_60 = 0;
      local_50 = 0;
      local_31 = this->suppress_empty_list_;
      bVar2 = this->preserve_proto_field_names_;
      bVar3 = this->use_ints_for_enums_;
      local_48 = __x;
      std::
      function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
      ::function(&local_d8,&this->field_scrub_callback_);
      if (pNVar7 != (Node *)0x0) {
        pNVar8 = pNVar7;
      }
      iVar6 = (*(this->super_ObjectWriter)._vptr_ObjectWriter[0x11])
                        (this,&name_local.length_,local_40,1,&local_70,0,&pNVar8->path_,
                         (ulong)local_31,(ulong)bVar2,(ulong)bVar3,&local_d8);
      pNVar7 = (Node *)CONCAT44(extraout_var_00,iVar6);
      std::_Function_base::~_Function_base(&local_d8.super__Function_base);
      std::__cxx11::string::~string((string *)&name_local.length_);
      __x = local_48;
      Node::AddChild(*local_48,pNVar7);
    }
    pNVar7->is_placeholder_ = false;
    if ((pNVar7->kind_ == OBJECT) &&
       ((int)((ulong)((long)(pNVar7->children_).
                            super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pNVar7->children_).
                           super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) == 0)) {
      (*pNVar7->_vptr_Node[2])(pNVar7,this->typeinfo_);
    }
    std::
    deque<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
    ::push_back(&(this->stack_).c,__x);
    this->current_ = pNVar7;
  }
  return this;
}

Assistant:

DefaultValueObjectWriter* DefaultValueObjectWriter::StartObject(
    StringPiece name) {
  if (current_ == nullptr) {
    std::vector<std::string> path;
    root_.reset(CreateNewNode(std::string(name), &type_, OBJECT,
                              DataPiece::NullData(), false, path,
                              suppress_empty_list_, preserve_proto_field_names_,
                              use_ints_for_enums_, field_scrub_callback_));
    root_->PopulateChildren(typeinfo_);
    current_ = root_.get();
    return this;
  }
  MaybePopulateChildrenOfAny(current_);
  Node* child = current_->FindChild(name);
  if (current_->kind() == LIST || current_->kind() == MAP || child == nullptr) {
    // If current_ is a list or a map node, we should create a new child and use
    // the type of current_ as the type of the new child.
    std::unique_ptr<Node> node(
        CreateNewNode(std::string(name),
                      ((current_->kind() == LIST || current_->kind() == MAP)
                           ? current_->type()
                           : nullptr),
                      OBJECT, DataPiece::NullData(), false,
                      child == nullptr ? current_->path() : child->path(),
                      suppress_empty_list_, preserve_proto_field_names_,
                      use_ints_for_enums_, field_scrub_callback_));
    child = node.get();
    current_->AddChild(node.release());
  }

  child->set_is_placeholder(false);
  if (child->kind() == OBJECT && child->number_of_children() == 0) {
    child->PopulateChildren(typeinfo_);
  }

  stack_.push(current_);
  current_ = child;
  return this;
}